

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::GuessLibraryInstallName(string *fullPath,string *soname)

{
  return false;
}

Assistant:

bool cmSystemTools::GuessLibraryInstallName(std::string const& fullPath,
                                       std::string& soname)
{
#if defined(CMAKE_USE_MACH_PARSER)
  cmMachO macho(fullPath.c_str());
  if(macho)
    {
    return macho.GetInstallName(soname);
    }
#else
  (void)fullPath;
  (void)soname;
#endif

  return false;
}